

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

int canvas_open_iter(char *path,t_canvasopen *co)

{
  int iVar1;
  int fd;
  t_canvasopen *co_local;
  char *path_local;
  
  iVar1 = sys_trytoopenone(path,co->name,co->ext,co->dirresult,co->nameresult,co->size,co->bin);
  if (iVar1 >= 0) {
    co->fd = iVar1;
  }
  path_local._4_4_ = (uint)(iVar1 < 0);
  return path_local._4_4_;
}

Assistant:

static int canvas_open_iter(const char *path, t_canvasopen *co)
{
    int fd;
    if ((fd = sys_trytoopenone(path, co->name, co->ext,
        co->dirresult, co->nameresult, co->size, co->bin)) >= 0)
    {
        co->fd = fd;
        return 0;
    }
    return 1;
}